

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int get_closure_var2(JSContext *ctx,JSFunctionDef *s,JSFunctionDef *fd,BOOL is_local,BOOL is_arg,
                    int var_idx,JSAtom var_name,BOOL is_const,BOOL is_lexical,JSVarKindEnum var_kind
                    )

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  if (s->parent != fd) {
    var_idx = get_closure_var2(ctx,s->parent,fd,is_local,is_arg,var_idx,var_name,is_const,is_lexical
                               ,var_kind);
    if (var_idx < 0) {
      lVar3 = 0xffffffff;
LAB_0015cc44:
      return (int)lVar3;
    }
    is_local = 0;
  }
  if (0 < (long)s->closure_var_count) {
    lVar3 = 0;
    do {
      if (((var_idx == (uint)s->closure_var[lVar3].var_idx) &&
          (bVar1 = *(byte *)(s->closure_var + lVar3), (bVar1 >> 1 & 1) == is_arg)) &&
         (is_local == (bVar1 & 1))) goto LAB_0015cc44;
      lVar3 = lVar3 + 1;
    } while (s->closure_var_count != lVar3);
  }
  iVar2 = add_closure_var(ctx,s,is_local,is_arg,var_idx,var_name,is_const,is_lexical,var_kind);
  return iVar2;
}

Assistant:

static int get_closure_var2(JSContext *ctx, JSFunctionDef *s,
                            JSFunctionDef *fd, BOOL is_local,
                            BOOL is_arg, int var_idx, JSAtom var_name,
                            BOOL is_const, BOOL is_lexical,
                            JSVarKindEnum var_kind)
{
    int i;

    if (fd != s->parent) {
        var_idx = get_closure_var2(ctx, s->parent, fd, is_local,
                                   is_arg, var_idx, var_name,
                                   is_const, is_lexical, var_kind);
        if (var_idx < 0)
            return -1;
        is_local = FALSE;
    }
    for(i = 0; i < s->closure_var_count; i++) {
        JSClosureVar *cv = &s->closure_var[i];
        if (cv->var_idx == var_idx && cv->is_arg == is_arg &&
            cv->is_local == is_local)
            return i;
    }
    return add_closure_var(ctx, s, is_local, is_arg, var_idx, var_name,
                           is_const, is_lexical, var_kind);
}